

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,128ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  bool bVar1;
  unsigned_long next;
  basic_string<char> *it;
  size_t next_start;
  size_t next_power;
  basic_string<char> *first_local;
  LowerBound<frozen::basic_string<char>,_std::less<frozen::basic_string<char>_>_> *this_local;
  basic_string<char> *local_10;
  
  bVar1 = std::less<frozen::basic_string<char>_>::operator()
                    (*(less<frozen::basic_string<char>_> **)(this + 8),
                     (basic_string<char> *)(first + 0x3f0),*(basic_string<char> **)this);
  if (bVar1) {
    local_10 = doitfirst<frozen::basic_string<char>const*,64ul>(this,first + 0x400);
  }
  else {
    local_10 = doit_fast<frozen::basic_string<char>const*,63ul>(this,first);
  }
  return local_10;
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }